

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O2

void STAT_ChangeLevel(char *newl)

{
  FLevelStatistics *pFVar1;
  FStatistics *pFVar2;
  FString FVar3;
  FString __src;
  int iVar4;
  uint uVar5;
  int iVar6;
  level_info_t *this;
  level_info_t *plVar7;
  MapData *this_00;
  char *pcVar8;
  tm *ptVar9;
  FILE *__stream;
  int iVar10;
  FStatistics *pFVar11;
  uint k;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  FSessionStatistics *pFVar16;
  ulong uVar17;
  FString infostring;
  FString section;
  time_t clock;
  FStatistics *local_90;
  FString lsection;
  FSessionStatistics s;
  
  StoreLevelStats();
  iVar4 = strncmp(newl,"enDSeQ",6);
  if (iVar4 == 0) {
    if (StartEpisode == (FEpisode *)0x0 || savestatistics.Value != 1) {
      return;
    }
  }
  else {
    this = FindLevelInfo(newl,true);
    plVar7 = level_info_t::CheckLevelRedirect(this);
    if (savestatistics.Value != 1) {
      return;
    }
    if (plVar7 != (level_info_t *)0x0) {
      this = plVar7;
    }
    if ((StartEpisode != (FEpisode *)0x0 & *(byte *)((long)&this->flags2 + 3) >> 5) != 1) {
      return;
    }
  }
  iVar4 = 0;
  this_00 = P_OpenMapData((StartEpisode->mEpisodeMap).Chars,false);
  if (this_00 != (MapData *)0x0) {
    iVar4 = FWadCollection::GetLumpFile(&Wads,this_00->lumpnum);
    MapData::~MapData(this_00);
    operator_delete(this_00,0xe8);
  }
  pcVar8 = FWadCollection::GetWadName(&Wads,iVar4);
  ExtractFileBase((char *)&clock,SUB81(pcVar8,0));
  FString::operator+((FString *)&s,(char *)&clock);
  FString::operator+(&section,(FString *)&s);
  FString::~FString((FString *)&s);
  FString::~FString((FString *)&clock);
  FString::ToUpper(&section);
  pcVar8 = (StartEpisode->mEpisodeName).Chars;
  if (*pcVar8 == '$') {
    pcVar8 = FStringTable::operator[](&GStrings,pcVar8 + 1);
  }
  pFVar11 = EpisodeStatistics.Array + -1;
  lVar15 = (ulong)EpisodeStatistics.Count + 1;
  do {
    lVar15 = lVar15 + -1;
    if (lVar15 == 0) {
      uVar5 = TArray<FStatistics,_FStatistics>::Reserve(&EpisodeStatistics,1);
      pFVar11 = EpisodeStatistics.Array;
      FString::operator=(&EpisodeStatistics.Array[uVar5].epi_header,section.Chars);
      pFVar11 = pFVar11 + uVar5;
      FString::operator=(&pFVar11->epi_name,pcVar8);
      break;
    }
    pFVar2 = pFVar11 + 1;
    pFVar11 = pFVar11 + 1;
    iVar4 = strcasecmp(section.Chars,(pFVar2->epi_header).Chars);
  } while (iVar4 != 0);
  infostring.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  uVar13 = 0;
  uVar17 = 0;
  uVar12 = 0;
  uVar14 = 0;
  for (lVar15 = 0; (ulong)LevelData.Count << 5 != lVar15; lVar15 = lVar15 + 0x20) {
    uVar13 = (ulong)(uint)((int)uVar13 + *(int *)((long)&(LevelData.Array)->killcount + lVar15));
    uVar17 = (ulong)(uint)((int)uVar17 + *(int *)((long)&(LevelData.Array)->totalkills + lVar15));
    uVar12 = (ulong)(uint)((int)uVar12 + *(int *)((long)&(LevelData.Array)->secretcount + lVar15));
    uVar14 = (ulong)(uint)((int)uVar14 + *(int *)((long)&(LevelData.Array)->totalsecrets + lVar15));
  }
  FString::Format(&infostring,"%4d/%4d, %3d/%3d, %2d",uVar13,uVar17,uVar12,uVar14,LevelData.Count);
  FVar3 = infostring;
  lVar15 = (long)level.totaltime;
  s.levelstats.Array = (FLevelStatistics *)0x0;
  s.levelstats.Most = 0;
  s.levelstats.Count = 0;
  time(&clock);
  ptVar9 = localtime(&clock);
  if (ptVar9 == (tm *)0x0) {
    builtin_strncpy(s.super_FLevelStatistics.name,"00.00.0000",0xb);
  }
  else {
    mysnprintf(s.super_FLevelStatistics.name,0xc,"%02d.%02d.%04d",(ulong)(uint)ptVar9->tm_mday,
               (ulong)(ptVar9->tm_mon + 1),(ulong)(ptVar9->tm_year + 0x76c));
  }
  iVar4 = G_SkillProperty(SKILLP_ACSReturn);
  s.super_FLevelStatistics.skill = (short)iVar4;
  strcpy((char *)&s,FVar3.Chars);
  s.super_FLevelStatistics.timeneeded = (int)((lVar15 * 0x62) / 100);
  TArray<FSessionStatistics,_FSessionStatistics>::Push(&pFVar11->stats,&s);
  uVar5 = (pFVar11->stats).Count;
  pFVar16 = (pFVar11->stats).Array;
  TArray<FLevelStatistics,_FLevelStatistics>::~TArray(&s.levelstats);
  local_90 = (FStatistics *)&pFVar16[uVar5 - 1].levelstats;
  lVar15 = 0x18;
  for (uVar17 = 0; uVar17 < LevelData.Count; uVar17 = uVar17 + 1) {
    FString::AttachToOther(&lsection,(FString *)((long)&(LevelData.Array)->totalkills + lVar15));
    FString::ToUpper(&lsection);
    FString::Format(&infostring,"%4d/%4d, %3d/%3d",
                    (ulong)*(uint *)((long)LevelData.Array + lVar15 + -0x14),
                    (ulong)*(uint *)((long)LevelData.Array + lVar15 + -0x18),
                    (ulong)*(uint *)((long)LevelData.Array + lVar15 + -0xc),
                    (ulong)*(uint *)((long)LevelData.Array + lVar15 + -0x10));
    __src = lsection;
    FVar3 = infostring;
    iVar4 = *(int *)((long)LevelData.Array + lVar15 + -8);
    time(&clock);
    localtime(&clock);
    strcpy(s.super_FLevelStatistics.name,__src.Chars);
    strcpy((char *)&s,FVar3.Chars);
    s.super_FLevelStatistics.timeneeded = iVar4;
    TArray<FLevelStatistics,_FLevelStatistics>::Push
              ((TArray<FLevelStatistics,_FLevelStatistics> *)local_90,&s.super_FLevelStatistics);
    FString::~FString(&lsection);
    lVar15 = lVar15 + 0x20;
  }
  __stream = fopen(statfile.Value,"wt");
  if (__stream != (FILE *)0x0) {
    qsort(EpisodeStatistics.Array,(ulong)EpisodeStatistics.Count,0x20,compare_episode_names);
    for (uVar17 = 0; pFVar11 = EpisodeStatistics.Array, uVar17 < EpisodeStatistics.Count;
        uVar17 = uVar17 + 1) {
      qsort(EpisodeStatistics.Array[uVar17].stats.Array,
            (ulong)EpisodeStatistics.Array[uVar17].stats.Count,0x48,compare_dates);
      pFVar11 = pFVar11 + uVar17;
      fprintf(__stream,"%s \"%s\"\n{\n",(pFVar11->epi_header).Chars,(pFVar11->epi_name).Chars);
      uVar13 = 0;
      local_90 = pFVar11;
      while (uVar12 = uVar13, uVar12 < (pFVar11->stats).Count) {
        pFVar16 = (pFVar11->stats).Array;
        uVar13 = uVar12 + 1;
        if ('\0' < pFVar16[uVar12].super_FLevelStatistics.info[0]) {
          pFVar16 = pFVar16 + uVar12;
          iVar4 = (pFVar16->super_FLevelStatistics).timeneeded;
          uVar12 = (long)iVar4 % 0x1ec30;
          iVar6 = (int)(short)((short)((long)iVar4 % 0x834) / 0x23);
          iVar10 = (int)(pFVar16->super_FLevelStatistics).skill;
          fprintf(__stream,"\t%2i. %10s \"%-22s\" %02d:%02d:%02d %i\n",uVar13 & 0xffffffff,
                  (pFVar16->super_FLevelStatistics).name,pFVar16,(long)iVar4 / 0x1ec30 & 0xffffffff,
                  (int)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) /
                       0x834),iVar6,iVar10);
          if ((pFVar16->levelstats).Count != 0) {
            fwrite("\t{\n",3,1,__stream);
            qsort((pFVar16->levelstats).Array,(ulong)(pFVar16->levelstats).Count,0x34,
                  compare_level_names);
            lVar15 = 0x22;
            for (uVar12 = 0; uVar12 < (pFVar16->levelstats).Count; uVar12 = uVar12 + 1) {
              pFVar1 = (pFVar16->levelstats).Array;
              iVar4 = *(int *)(pFVar1->info + lVar15 + 0xe);
              uVar14 = (long)iVar4 % 0x1ec30;
              fprintf(__stream,"\t\t%-8s \"%-22s\" %02d:%02d:%02d\n",pFVar1->info + lVar15,
                      pFVar1->info + lVar15 + -0x22,(long)iVar4 / 0x1ec30 & 0xffffffff,
                      (long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) /
                      0x834 & 0xffffffff,(int)(short)((short)((long)iVar4 % 0x834) / 0x23),iVar6,
                      iVar10);
              lVar15 = lVar15 + 0x34;
            }
            fwrite("\t}\n",3,1,__stream);
            pFVar11 = local_90;
          }
        }
      }
      fwrite("}\n\n",3,1,__stream);
    }
    fclose(__stream);
  }
  FString::~FString(&infostring);
  FString::~FString(&section);
  return;
}

Assistant:

void STAT_ChangeLevel(const char *newl)
{
	// record the current level's stats.
	StoreLevelStats();

	level_info_t *thisinfo = level.info;
	level_info_t *nextinfo = NULL;
	
	if (strncmp(newl, "enDSeQ", 6))
	{
		level_info_t *l = FindLevelInfo (newl);
		nextinfo = l->CheckLevelRedirect ();
		if (nextinfo == NULL) nextinfo = l;
	}

	if (savestatistics == 1)
	{
		if ((nextinfo == NULL || (nextinfo->flags2 & LEVEL2_ENDGAME)) && StartEpisode != NULL)
		{
			// we reached the end of this episode
			int wad = 0;
			MapData * map = P_OpenMapData(StartEpisode->mEpisodeMap, false);
			if (map != NULL)
			{
				wad = Wads.GetLumpFile(map->lumpnum);
				delete map;
			}
			const char * name = Wads.GetWadName(wad);
			FString section = ExtractFileBase(name) + "." + StartEpisode->mEpisodeMap;
			section.ToUpper();

			const char *ep_name = StartEpisode->mEpisodeName;
			if (*ep_name == '$') ep_name = GStrings[ep_name+1];
			FStatistics *sl = GetStatisticsList(EpisodeStatistics, section, ep_name);

			int statvals[4] = {0,0,0,0};
			FString infostring;
			int validlevels = LevelData.Size();
			for(unsigned i = 0; i < LevelData.Size(); i++)
			{
				statvals[0] += LevelData[i].killcount;
				statvals[1] += LevelData[i].totalkills;
				statvals[2] += LevelData[i].secretcount;
				statvals[3] += LevelData[i].totalsecrets;
			}

			infostring.Format("%4d/%4d, %3d/%3d, %2d", statvals[0], statvals[1], statvals[2], statvals[3], validlevels);
			FSessionStatistics *es = StatisticsEntry(sl, infostring, AdjustTics(level.totaltime));

			for(unsigned i = 0; i < LevelData.Size(); i++)
			{
				FString lsection = LevelData[i].Levelname;
				lsection.ToUpper();
				infostring.Format("%4d/%4d, %3d/%3d",
					 LevelData[i].killcount, LevelData[i].totalkills, LevelData[i].secretcount, LevelData[i].totalsecrets);

				LevelStatEntry(es, lsection, infostring, LevelData[i].leveltime);
			}
			SaveStatistics(statfile, EpisodeStatistics);
		}
	}
	else if (savestatistics == 2)	// todo: handle single level statistics.
	{
	}
}